

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  long lVar2;
  int i;
  long lVar3;
  
  io::Printer::Print(printer,"void $classname$::SharedCtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"_cached_size_ = 0;\n");
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(this->descriptor_ + 0x2c); lVar3 = lVar3 + 1) {
    pFVar1 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar2));
    (*pFVar1->_vptr_FieldGenerator[9])(pFVar1,printer);
    lVar2 = lVar2 + 0x78;
  }
  io::Printer::Print(printer,"::memset(_has_bits_, 0, sizeof(_has_bits_));\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedConstructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedCtor() {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "_cached_size_ = 0;\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateConstructorCode(printer);
  }

  printer->Print(
    "::memset(_has_bits_, 0, sizeof(_has_bits_));\n");

  printer->Outdent();
  printer->Print("}\n\n");
}